

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

uint64_t __thiscall
leveldb::VersionSet::ApproximateOffsetOf(VersionSet *this,Version *v,InternalKey *ikey)

{
  int iVar1;
  size_type sVar2;
  const_reference ppFVar3;
  uint64_t uVar4;
  ReadOptions *in_RDX;
  TableCache *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Iterator *iter;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int level;
  uint64_t result;
  Table *tableptr;
  ReadOptions *in_stack_ffffffffffffff48;
  Iterator *in_stack_ffffffffffffff50;
  InternalKey *in_stack_ffffffffffffff58;
  InternalKey *in_stack_ffffffffffffff60;
  InternalKeyComparator *in_stack_ffffffffffffff68;
  ulong local_68;
  Table **tableptr_00;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  Table *this_00;
  undefined1 local_20 [16];
  InternalKey *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (Table *)0x0;
  iVar5 = 0;
  do {
    if (6 < iVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (uint64_t)this_00;
    }
    tableptr_00 = (Table **)((long)&(in_RSI->dbname_).field_2 + (long)iVar5 * 0x18 + 8);
    for (local_68 = 0;
        sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffff48), local_68 < sVar2; local_68 = local_68 + 1)
    {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
      iVar1 = InternalKeyComparator::Compare
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58);
      if (iVar1 < 1) {
        ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
        this_00 = (Table *)((long)&this_00->rep_ + (*ppFVar3)->file_size);
      }
      else {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
        iVar1 = InternalKeyComparator::Compare
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff58);
        if (iVar1 < 1) {
          in_stack_ffffffffffffff60 = *(InternalKey **)(in_RDI + 0x30);
          memset(local_20,0,0x10);
          ReadOptions::ReadOptions(in_stack_ffffffffffffff48);
          ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff68 = (InternalKeyComparator *)(*ppFVar3)->number;
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff50 =
               TableCache::NewIterator
                         (in_RSI,in_RDX,(uint64_t)this_00,CONCAT44(iVar5,in_stack_ffffffffffffffa8),
                          tableptr_00);
          if (local_10 != (InternalKey *)0x0) {
            in_stack_ffffffffffffff58 = local_10;
            InternalKey::Encode(local_10);
            uVar4 = Table::ApproximateOffsetOf
                              (this_00,(Slice *)CONCAT44(iVar5,in_stack_ffffffffffffffa8));
            this_00 = (Table *)((long)&this_00->rep_ + uVar4);
          }
          if (in_stack_ffffffffffffff50 != (Iterator *)0x0) {
            (*in_stack_ffffffffffffff50->_vptr_Iterator[1])();
          }
        }
        else if (0 < iVar5) break;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

uint64_t VersionSet::ApproximateOffsetOf(Version* v, const InternalKey& ikey) {
  uint64_t result = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = v->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      if (icmp_.Compare(files[i]->largest, ikey) <= 0) {
        // Entire file is before "ikey", so just add the file size
        result += files[i]->file_size;
      } else if (icmp_.Compare(files[i]->smallest, ikey) > 0) {
        // Entire file is after "ikey", so ignore
        if (level > 0) {
          // Files other than level 0 are sorted by meta->smallest, so
          // no further files in this level will contain data for
          // "ikey".
          break;
        }
      } else {
        // "ikey" falls in the range for this table.  Add the
        // approximate offset of "ikey" within the table.
        Table* tableptr;
        Iterator* iter = table_cache_->NewIterator(
            ReadOptions(), files[i]->number, files[i]->file_size, &tableptr);
        if (tableptr != nullptr) {
          result += tableptr->ApproximateOffsetOf(ikey.Encode());
        }
        delete iter;
      }
    }
  }
  return result;
}